

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O2

int __thiscall gl4cts::ConditionalRenderInverted::Tests::init(Tests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  CoverageTest *this_00;
  FunctionalTest *this_01;
  
  this_00 = (CoverageTest *)operator_new(0x80);
  CoverageTest::CoverageTest(this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (FunctionalTest *)operator_new(0x90);
  ConditionalRenderInverted::FunctionalTest::FunctionalTest
            (this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  return extraout_EAX;
}

Assistant:

void gl4cts::ConditionalRenderInverted::Tests::init()
{
	addChild(new gl4cts::ConditionalRenderInverted::CoverageTest(m_context));
	addChild(new gl4cts::ConditionalRenderInverted::FunctionalTest(m_context));
}